

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O0

void __thiscall helics::apps::Probe::Probe(Probe *this,string_view appName,FederateInfo *fedInfo)

{
  string_view appName_00;
  Endpoint *in_RSI;
  undefined8 *in_RDI;
  FederateInfo *in_stack_00000008;
  App *in_stack_00000010;
  
  appName_00._M_str = (char *)this;
  appName_00._M_len = (size_t)fedInfo;
  App::App(in_stack_00000010,appName_00,in_stack_00000008);
  *in_RDI = &PTR__Probe_00a47720;
  Endpoint::Endpoint(in_RSI);
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  return;
}

Assistant:

Probe::Probe(std::string_view appName, const FederateInfo& fedInfo): App(appName, fedInfo) {}